

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Extractor::input(Extractor *this,int blob_index,Mat *in)

{
  Mat *pMVar1;
  pointer pMVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar6 = -1;
  if ((-1 < blob_index) &&
     (pMVar2 = (this->d->blob_mats).super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start,
     blob_index <
     (int)((ulong)((long)(this->d->blob_mats).
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pMVar2) >> 3) * 0x38e38e39)) {
    pMVar1 = pMVar2 + (uint)blob_index;
    iVar6 = 0;
    if (pMVar1 != in) {
      piVar3 = in->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = pMVar1->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (pMVar1->allocator == (Allocator *)0x0) {
            if (pMVar1->data != (void *)0x0) {
              free(pMVar1->data);
            }
          }
          else {
            (*pMVar1->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar1->cstep = 0;
      pMVar1->data = (void *)0x0;
      pMVar1->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
      pMVar1->dims = 0;
      pMVar1->w = 0;
      pMVar1->h = 0;
      pMVar1->d = 0;
      pMVar1->c = 0;
      piVar3 = in->refcount;
      pMVar1->data = in->data;
      pMVar1->refcount = piVar3;
      pMVar1->elemsize = in->elemsize;
      pMVar1->elempack = in->elempack;
      pMVar1->allocator = in->allocator;
      iVar6 = in->w;
      iVar4 = in->h;
      iVar5 = in->d;
      pMVar1->dims = in->dims;
      pMVar1->w = iVar6;
      pMVar1->h = iVar4;
      pMVar1->d = iVar5;
      pMVar1->c = in->c;
      pMVar1->cstep = in->cstep;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int Extractor::input(int blob_index, const Mat& in)
{
    if (blob_index < 0 || blob_index >= (int)d->blob_mats.size())
        return -1;

    d->blob_mats[blob_index] = in;

    return 0;
}